

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int *piVar9;
  cpp_dec_float<100U,_int,_void> *pcVar10;
  long lVar11;
  cpp_dec_float<100U,_int,_void> *pcVar12;
  cpp_dec_float<100U,_int,_void> *pcVar13;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  ulong local_1d0;
  cpp_dec_float<100U,_int,_void> local_1b8;
  int *local_160;
  cpp_dec_float<100U,_int,_void> local_158;
  int *local_108;
  pointer local_100;
  int *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  cpp_dec_float<100U,_int,_void> local_e8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_90;
  cpp_dec_float<100U,_int,_void> local_88;
  
  local_158.fpclass = cpp_dec_float_finite;
  local_158.prec_elem = 0x10;
  local_158.data._M_elems[0] = 0;
  local_158.data._M_elems[1] = 0;
  local_158.data._M_elems[2] = 0;
  local_158.data._M_elems[3] = 0;
  local_158.data._M_elems[4] = 0;
  local_158.data._M_elems[5] = 0;
  local_158.data._M_elems[6] = 0;
  local_158.data._M_elems[7] = 0;
  local_158.data._M_elems[8] = 0;
  local_158.data._M_elems[9] = 0;
  local_158.data._M_elems[10] = 0;
  local_158.data._M_elems[0xb] = 0;
  local_158.data._M_elems[0xc] = 0;
  local_158.data._M_elems[0xd] = 0;
  local_158.data._M_elems._56_5_ = 0;
  local_158.data._M_elems[0xf]._1_3_ = 0;
  local_158.exp = 0;
  local_158.neg = false;
  local_100 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_108 = (this->l).idx;
  local_160 = (this->l).row;
  local_f8 = (this->l).start;
  local_1d0 = (ulong)(this->l).firstUpdate;
  if ((long)local_1d0 < 1) {
    local_1d0 = 0;
  }
  else {
    uVar7 = 0;
    local_f0 = vec;
    local_90 = this;
    do {
      iVar6 = local_160[uVar7];
      local_158.data._M_elems._0_8_ = *(undefined8 *)vec[iVar6].m_backend.data._M_elems;
      local_158.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar6].m_backend.data._M_elems + 2);
      puVar1 = vec[iVar6].m_backend.data._M_elems + 4;
      local_158.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_158.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = vec[iVar6].m_backend.data._M_elems + 8;
      local_158.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_158.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = vec[iVar6].m_backend.data._M_elems + 0xc;
      local_158.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_158.data._M_elems._56_5_ = SUB85(uVar4,0);
      local_158.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_158.exp = vec[iVar6].m_backend.exp;
      local_158.neg = vec[iVar6].m_backend.neg;
      local_158.fpclass = vec[iVar6].m_backend.fpclass;
      local_158.prec_elem = vec[iVar6].m_backend.prec_elem;
      if (local_158.fpclass == cpp_dec_float_NaN) {
LAB_003e86e6:
        iVar6 = local_f8[uVar7];
        iVar8 = local_f8[uVar7 + 1];
        if (iVar6 < iVar8) {
          pcVar12 = &local_100[iVar6].m_backend;
          piVar9 = local_108 + iVar6;
          do {
            local_1b8.fpclass = cpp_dec_float_finite;
            local_1b8.prec_elem = 0x10;
            local_1b8.data._M_elems[0] = 0;
            local_1b8.data._M_elems[1] = 0;
            local_1b8.data._M_elems[2] = 0;
            local_1b8.data._M_elems[3] = 0;
            local_1b8.data._M_elems[4] = 0;
            local_1b8.data._M_elems[5] = 0;
            local_1b8.data._M_elems[6] = 0;
            local_1b8.data._M_elems[7] = 0;
            local_1b8.data._M_elems[8] = 0;
            local_1b8.data._M_elems[9] = 0;
            local_1b8.data._M_elems[10] = 0;
            local_1b8.data._M_elems[0xb] = 0;
            local_1b8.data._M_elems[0xc] = 0;
            local_1b8.data._M_elems[0xd] = 0;
            local_1b8.data._M_elems._56_5_ = 0;
            local_1b8.data._M_elems[0xf]._1_3_ = 0;
            local_1b8.exp = 0;
            local_1b8.neg = false;
            pcVar10 = &local_158;
            if (pcVar12 != &local_1b8) {
              local_1b8.data._M_elems[0xc] = local_158.data._M_elems[0xc];
              local_1b8.data._M_elems[0xd] = local_158.data._M_elems[0xd];
              local_1b8.data._M_elems._56_5_ = local_158.data._M_elems._56_5_;
              local_1b8.data._M_elems[0xf]._1_3_ = local_158.data._M_elems[0xf]._1_3_;
              local_1b8.data._M_elems[8] = local_158.data._M_elems[8];
              local_1b8.data._M_elems[9] = local_158.data._M_elems[9];
              local_1b8.data._M_elems[10] = local_158.data._M_elems[10];
              local_1b8.data._M_elems[0xb] = local_158.data._M_elems[0xb];
              local_1b8.data._M_elems[4] = local_158.data._M_elems[4];
              local_1b8.data._M_elems[5] = local_158.data._M_elems[5];
              local_1b8.data._M_elems[6] = local_158.data._M_elems[6];
              local_1b8.data._M_elems[7] = local_158.data._M_elems[7];
              local_1b8.data._M_elems[0] = local_158.data._M_elems[0];
              local_1b8.data._M_elems[1] = local_158.data._M_elems[1];
              local_1b8.data._M_elems[2] = local_158.data._M_elems[2];
              local_1b8.data._M_elems[3] = local_158.data._M_elems[3];
              local_1b8.exp = local_158.exp;
              local_1b8.neg = local_158.neg;
              local_1b8.fpclass = local_158.fpclass;
              local_1b8.prec_elem = local_158.prec_elem;
              pcVar10 = pcVar12;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      (&local_1b8,pcVar10);
            local_88.fpclass = cpp_dec_float_finite;
            local_88.prec_elem = 0x10;
            local_88.data._M_elems[0] = 0;
            local_88.data._M_elems[1] = 0;
            local_88.data._M_elems[2] = 0;
            local_88.data._M_elems[3] = 0;
            local_88.data._M_elems[4] = 0;
            local_88.data._M_elems[5] = 0;
            local_88.data._M_elems[6] = 0;
            local_88.data._M_elems[7] = 0;
            local_88.data._M_elems[8] = 0;
            local_88.data._M_elems[9] = 0;
            local_88.data._M_elems[10] = 0;
            local_88.data._M_elems[0xb] = 0;
            local_88.data._M_elems[0xc] = 0;
            local_88.data._M_elems[0xd] = 0;
            local_88.data._M_elems._56_5_ = 0;
            local_88.data._M_elems[0xf]._1_3_ = 0;
            local_88.exp = 0;
            local_88.neg = false;
            pcVar10 = &local_158;
            if (pcVar12 != &local_88) {
              local_88.data._M_elems[0xc] = local_158.data._M_elems[0xc];
              local_88.data._M_elems[0xd] = local_158.data._M_elems[0xd];
              local_88.data._M_elems._56_5_ = local_158.data._M_elems._56_5_;
              local_88.data._M_elems[0xf]._1_3_ = local_158.data._M_elems[0xf]._1_3_;
              local_88.data._M_elems[8] = local_158.data._M_elems[8];
              local_88.data._M_elems[9] = local_158.data._M_elems[9];
              local_88.data._M_elems[10] = local_158.data._M_elems[10];
              local_88.data._M_elems[0xb] = local_158.data._M_elems[0xb];
              local_88.data._M_elems[4] = local_158.data._M_elems[4];
              local_88.data._M_elems[5] = local_158.data._M_elems[5];
              local_88.data._M_elems[6] = local_158.data._M_elems[6];
              local_88.data._M_elems[7] = local_158.data._M_elems[7];
              local_88.data._M_elems[0] = local_158.data._M_elems[0];
              local_88.data._M_elems[1] = local_158.data._M_elems[1];
              local_88.data._M_elems[2] = local_158.data._M_elems[2];
              local_88.data._M_elems[3] = local_158.data._M_elems[3];
              local_88.exp = local_158.exp;
              local_88.neg = local_158.neg;
              local_88.fpclass = local_158.fpclass;
              local_88.prec_elem = local_158.prec_elem;
              pcVar10 = pcVar12;
            }
            pcVar13 = &local_f0[*piVar9].m_backend;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      (&local_88,pcVar10);
            local_e8.fpclass = cpp_dec_float_finite;
            local_e8.prec_elem = 0x10;
            local_e8.data._M_elems[0] = 0;
            local_e8.data._M_elems[1] = 0;
            local_e8.data._M_elems[2] = 0;
            local_e8.data._M_elems[3] = 0;
            local_e8.data._M_elems[4] = 0;
            local_e8.data._M_elems[5] = 0;
            local_e8.data._M_elems[6] = 0;
            local_e8.data._M_elems[7] = 0;
            local_e8.data._M_elems[8] = 0;
            local_e8.data._M_elems[9] = 0;
            local_e8.data._M_elems[10] = 0;
            local_e8.data._M_elems[0xb] = 0;
            local_e8.data._M_elems[0xc] = 0;
            local_e8.data._M_elems[0xd] = 0;
            local_e8.data._M_elems._56_5_ = 0;
            local_e8.data._M_elems[0xf]._1_3_ = 0;
            local_e8.exp = 0;
            local_e8.neg = false;
            if (&local_e8 != pcVar13) {
              local_e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar13->data)._M_elems;
              local_e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 2);
              local_e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
              local_e8.data._M_elems._24_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 6);
              local_e8.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
              local_e8.data._M_elems._40_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 10);
              local_e8.data._M_elems._48_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 0xc);
              uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 0xe);
              local_e8.data._M_elems._56_5_ = SUB85(uVar4,0);
              local_e8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_e8.exp = *(int *)(&pcVar13->data + 1);
              local_e8.neg = *(bool *)((long)(&pcVar13->data + 1) + 4);
              local_e8._72_8_ = *(undefined8 *)((long)(&pcVar13->data + 1) + 8);
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_e8,&local_88);
            local_1b8.fpclass = cpp_dec_float_finite;
            local_1b8.prec_elem = 0x10;
            local_1b8.data._M_elems[0] = 0;
            local_1b8.data._M_elems[1] = 0;
            local_1b8.data._M_elems[2] = 0;
            local_1b8.data._M_elems[3] = 0;
            local_1b8.data._M_elems[4] = 0;
            local_1b8.data._M_elems[5] = 0;
            local_1b8.data._M_elems[6] = 0;
            local_1b8.data._M_elems[7] = 0;
            local_1b8.data._M_elems[8] = 0;
            local_1b8.data._M_elems[9] = 0;
            local_1b8.data._M_elems[10] = 0;
            local_1b8.data._M_elems[0xb] = 0;
            local_1b8.data._M_elems[0xc] = 0;
            local_1b8.data._M_elems[0xd] = 0;
            local_1b8.data._M_elems._56_5_ = 0;
            local_1b8.data._M_elems[0xf]._1_3_ = 0;
            local_1b8.exp = 0;
            local_1b8.neg = false;
            pcVar10 = &local_158;
            if (pcVar12 != &local_1b8) {
              local_1b8.data._M_elems[0xc] = local_158.data._M_elems[0xc];
              local_1b8.data._M_elems[0xd] = local_158.data._M_elems[0xd];
              local_1b8.data._M_elems._56_5_ = local_158.data._M_elems._56_5_;
              local_1b8.data._M_elems[0xf]._1_3_ = local_158.data._M_elems[0xf]._1_3_;
              local_1b8.data._M_elems[8] = local_158.data._M_elems[8];
              local_1b8.data._M_elems[9] = local_158.data._M_elems[9];
              local_1b8.data._M_elems[10] = local_158.data._M_elems[10];
              local_1b8.data._M_elems[0xb] = local_158.data._M_elems[0xb];
              local_1b8.data._M_elems[4] = local_158.data._M_elems[4];
              local_1b8.data._M_elems[5] = local_158.data._M_elems[5];
              local_1b8.data._M_elems[6] = local_158.data._M_elems[6];
              local_1b8.data._M_elems[7] = local_158.data._M_elems[7];
              local_1b8.data._M_elems[0] = local_158.data._M_elems[0];
              local_1b8.data._M_elems[1] = local_158.data._M_elems[1];
              local_1b8.data._M_elems[2] = local_158.data._M_elems[2];
              local_1b8.data._M_elems[3] = local_158.data._M_elems[3];
              local_1b8.exp = local_158.exp;
              local_1b8.neg = local_158.neg;
              local_1b8.fpclass = local_158.fpclass;
              local_1b8.prec_elem = local_158.prec_elem;
              pcVar10 = pcVar12;
            }
            pcVar12 = pcVar12 + 1;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      (&local_1b8,pcVar10);
            vec = local_f0;
            iVar2 = *piVar9;
            piVar9 = piVar9 + 1;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_f0[iVar2].m_backend,&local_1b8);
            iVar8 = iVar8 + -1;
          } while (iVar6 < iVar8);
        }
      }
      else {
        local_1b8.fpclass = cpp_dec_float_finite;
        local_1b8.prec_elem = 0x10;
        local_1b8.data._M_elems[0] = 0;
        local_1b8.data._M_elems[1] = 0;
        local_1b8.data._M_elems[2] = 0;
        local_1b8.data._M_elems[3] = 0;
        local_1b8.data._M_elems[4] = 0;
        local_1b8.data._M_elems[5] = 0;
        local_1b8.data._M_elems[6] = 0;
        local_1b8.data._M_elems[7] = 0;
        local_1b8.data._M_elems[8] = 0;
        local_1b8.data._M_elems[9] = 0;
        local_1b8.data._M_elems[10] = 0;
        local_1b8.data._M_elems[0xb] = 0;
        local_1b8.data._M_elems[0xc] = 0;
        local_1b8.data._M_elems[0xd] = 0;
        local_1b8.data._M_elems._56_5_ = 0;
        local_1b8.data._M_elems[0xf]._1_3_ = 0;
        local_1b8.exp = 0;
        local_1b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_1b8,0.0);
        iVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (&local_158,&local_1b8);
        if (iVar6 != 0) goto LAB_003e86e6;
      }
      uVar7 = uVar7 + 1;
      this = local_90;
    } while (uVar7 != local_1d0);
  }
  if ((this->l).updateType != 0) {
    uVar3 = (this->l).firstUnused;
    if ((int)local_1d0 < (int)uVar3) {
      local_1d0 = local_1d0 & 0xffffffff;
      do {
        iVar6 = local_f8[local_1d0];
        lVar11 = (long)local_160[local_1d0];
        local_1b8.data._M_elems[0] = vec[lVar11].m_backend.data._M_elems[0];
        puVar1 = vec[lVar11].m_backend.data._M_elems + 0xc;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_1b8.data._M_elems[0xd] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
        local_1b8.data._M_elems._56_5_ = SUB85(uVar4,0);
        local_1b8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        puVar1 = vec[lVar11].m_backend.data._M_elems + 9;
        uVar4 = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        local_1b8.data._M_elems[9] = (uint)uVar4;
        local_1b8.data._M_elems[10] = (uint)((ulong)uVar4 >> 0x20);
        local_1b8.data._M_elems[0xb] = (uint)uVar5;
        local_1b8.data._M_elems[0xc] = (uint)((ulong)uVar5 >> 0x20);
        puVar1 = vec[lVar11].m_backend.data._M_elems + 5;
        uVar4 = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        local_1b8.data._M_elems[5] = (uint)uVar4;
        local_1b8.data._M_elems[6] = (uint)((ulong)uVar4 >> 0x20);
        local_1b8.data._M_elems[7] = (uint)uVar5;
        local_1b8.data._M_elems[8] = (uint)((ulong)uVar5 >> 0x20);
        puVar1 = vec[lVar11].m_backend.data._M_elems + 1;
        uVar4 = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        local_1b8.data._M_elems[1] = (uint)uVar4;
        local_1b8.data._M_elems[2] = (uint)((ulong)uVar4 >> 0x20);
        local_1b8.data._M_elems[3] = (uint)uVar5;
        local_1b8.data._M_elems[4] = (uint)((ulong)uVar5 >> 0x20);
        local_1b8.exp = vec[lVar11].m_backend.exp;
        local_1b8.fpclass = vec[lVar11].m_backend.fpclass;
        local_1b8.neg =
             (bool)((local_1b8.data._M_elems[0] != 0 || local_1b8.fpclass != cpp_dec_float_finite) ^
                   vec[lVar11].m_backend.neg);
        local_1b8.prec_elem = vec[lVar11].m_backend.prec_elem;
        iVar8 = local_f8[local_1d0 + 1];
        if (iVar6 < iVar8) {
          pcVar12 = &local_100[iVar6].m_backend;
          piVar9 = local_108 + iVar6;
          do {
            pcVar13 = &vec[*piVar9].m_backend;
            local_e8.fpclass = cpp_dec_float_finite;
            local_e8.prec_elem = 0x10;
            local_e8.data._M_elems[0] = 0;
            local_e8.data._M_elems[1] = 0;
            local_e8.data._M_elems[2] = 0;
            local_e8.data._M_elems[3] = 0;
            local_e8.data._M_elems[4] = 0;
            local_e8.data._M_elems[5] = 0;
            local_e8.data._M_elems[6] = 0;
            local_e8.data._M_elems[7] = 0;
            local_e8.data._M_elems[8] = 0;
            local_e8.data._M_elems[9] = 0;
            local_e8.data._M_elems[10] = 0;
            local_e8.data._M_elems[0xb] = 0;
            local_e8.data._M_elems[0xc] = 0;
            local_e8.data._M_elems[0xd] = 0;
            local_e8.data._M_elems._56_5_ = 0;
            local_e8.data._M_elems[0xf]._1_3_ = 0;
            local_e8.exp = 0;
            local_e8.neg = false;
            pcVar10 = pcVar13;
            if ((pcVar12 != &local_e8) && (pcVar10 = pcVar12, &local_e8 != pcVar13)) {
              local_e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar13->data)._M_elems;
              local_e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 2);
              local_e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
              local_e8.data._M_elems._24_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 6);
              local_e8.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
              local_e8.data._M_elems._40_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 10);
              local_e8.data._M_elems._48_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 0xc);
              uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 0xe);
              local_e8.data._M_elems._56_5_ = SUB85(uVar4,0);
              local_e8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_e8.exp = pcVar13->exp;
              local_e8.neg = pcVar13->neg;
              local_e8.fpclass = pcVar13->fpclass;
              local_e8.prec_elem = pcVar13->prec_elem;
            }
            piVar9 = piVar9 + 1;
            pcVar12 = pcVar12 + 1;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      (&local_e8,pcVar10);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&local_1b8,&local_e8);
            iVar8 = iVar8 + -1;
          } while (iVar6 < iVar8);
          lVar11 = (long)local_160[local_1d0];
        }
        local_1d0 = local_1d0 + 1;
        vec[lVar11].m_backend.data._M_elems[0] = local_1b8.data._M_elems[0];
        puVar1 = vec[lVar11].m_backend.data._M_elems + 1;
        *(ulong *)puVar1 = CONCAT44(local_1b8.data._M_elems[2],local_1b8.data._M_elems[1]);
        *(ulong *)(puVar1 + 2) = CONCAT44(local_1b8.data._M_elems[4],local_1b8.data._M_elems[3]);
        puVar1 = vec[lVar11].m_backend.data._M_elems + 5;
        *(ulong *)puVar1 = CONCAT44(local_1b8.data._M_elems[6],local_1b8.data._M_elems[5]);
        *(ulong *)(puVar1 + 2) = CONCAT44(local_1b8.data._M_elems[8],local_1b8.data._M_elems[7]);
        puVar1 = vec[lVar11].m_backend.data._M_elems + 9;
        *(ulong *)puVar1 = CONCAT44(local_1b8.data._M_elems[10],local_1b8.data._M_elems[9]);
        *(ulong *)(puVar1 + 2) = CONCAT44(local_1b8.data._M_elems[0xc],local_1b8.data._M_elems[0xb])
        ;
        puVar1 = vec[lVar11].m_backend.data._M_elems + 0xc;
        *(ulong *)puVar1 = CONCAT44(local_1b8.data._M_elems[0xd],local_1b8.data._M_elems[0xc]);
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_1b8.data._M_elems[0xf]._1_3_,local_1b8.data._M_elems._56_5_);
        vec[lVar11].m_backend.exp = local_1b8.exp;
        vec[lVar11].m_backend.neg =
             (bool)((local_1b8.fpclass != cpp_dec_float_finite || local_1b8.data._M_elems[0] != 0) ^
                   local_1b8.neg);
        vec[lVar11].m_backend.fpclass = local_1b8.fpclass;
        vec[lVar11].m_backend.prec_elem = local_1b8.prec_elem;
      } while (local_1d0 != uVar3);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLright(R* vec)
{
   int i, j, k;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = 0; i < end; ++i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);

         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            SPxOut::debug(this, "                         -> y{} -= {} * {} = {}    -> {}\n", *idx, x, *val,
                          x * (*val), vec[*idx] - x * (*val));
            vec[*idx++] -= x * (*val++);
         }
      }
   }

   if(l.updateType)                      /* Forest-Tomlin Updates */
   {
      SPxOut::debug(this, "performing FT updates...\n");

      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);
         StableSum<R> tmp(-vec[lrow[i]]);

         for(j = lbeg[i + 1]; j > k; --j)
            tmp += vec[*idx++] * (*val++);

         vec[lrow[i]] = -R(tmp);

         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);
      }

      SPxOut::debug(this, "finished FT updates.\n");
   }
}